

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3a70a8::InitListExpr::printLeft(InitListExpr *this,OutputStream *S)

{
  if (this->Ty != (Node *)0x0) {
    Node::print(this->Ty,S);
  }
  OutputStream::operator+=(S,'{');
  NodeArray::printWithComma(&this->Inits,S);
  OutputStream::operator+=(S,'}');
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (Ty)
      Ty->print(S);
    S += '{';
    Inits.printWithComma(S);
    S += '}';
  }